

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap32::SetPageMarkCount(HeapBlockMap32 *this,void *address,ushort markCount)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVStatic<256UL> *this_01;
  uint uVar5;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x143,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar2) goto LAB_006be1d3;
    *puVar4 = 0;
  }
  uVar5 = (uint)address >> 0xc & 0xff;
  this_01 = BVStatic<65536ul>::GetRange<256ul>((BVStatic<65536ul> *)this_00,uVar5 << 8);
  BVar3 = BVStatic<256UL>::Count(this_01);
  if (BVar3 != markCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x14e,"(l2map->GetPageMarkBitVector(id2)->Count() == markCount)",
                       "l2map->GetPageMarkBitVector(id2)->Count() == markCount");
    if (!bVar2) {
LAB_006be1d3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00->pageMarkCount[uVar5] = markCount;
  return;
}

Assistant:

void
HeapBlockMap32::SetPageMarkCount(void * address, ushort markCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    // Callers should already have updated the mark bits by the time they call this,
    // so check that the new count is correct for the current mark bits.
    // Not true right now, will be true...
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
    Assert(l2map->GetPageMarkBitVector(id2)->Count() == markCount || heapBlock->WasAllocatedFromDuringSweep());
#else
    Assert(l2map->GetPageMarkBitVector(id2)->Count() == markCount);
#endif

    l2map->pageMarkCount[id2] = markCount;
}